

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O0

void __thiscall Fifteen::setTilesNumeric(Fifteen *this)

{
  bool bVar1;
  uint uVar2;
  pointer pCVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  QString *other;
  pointer this_01;
  vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
  *this_02;
  const_reference pvVar4;
  size_type sVar5;
  reference pvVar6;
  pointer pQVar7;
  QString local_100;
  unsigned_long *local_e8;
  unsigned_long *local_e0;
  key_type local_d4;
  unsigned_long *local_d0;
  unsigned_long *local_c8;
  unsigned_long *local_c0;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_b8;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_b0;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  iter;
  size_t nullValue;
  reference local_88;
  unique_ptr<QPushButton,_std::default_delete<QPushButton>_> *tile;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
  *__range1;
  size_t valuesIndex;
  vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
  *tiles;
  QString tileColor;
  QFont local_30 [8];
  QFont font;
  size_t fontSize;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *values;
  Fifteen *this_local;
  
  pCVar3 = std::unique_ptr<Controller,_std::default_delete<Controller>_>::operator->
                     (&this->controller);
  this_00 = Controller::getValues(pCVar3);
  pCVar3 = std::unique_ptr<Controller,_std::default_delete<Controller>_>::operator->
                     (&this->controller);
  Controller::getFontSize(pCVar3);
  QFont::QFont(local_30);
  QFont::setPixelSize((int)local_30);
  other = Options::getTileColor();
  QString::QString((QString *)&tiles,other);
  this_01 = std::unique_ptr<TilesBoard,_std::default_delete<TilesBoard>_>::operator->
                      (&this->tilesBoard);
  this_02 = TilesBoard::getTiles(this_01);
  __range1 = (vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
              *)0x0;
  __end1 = std::
           vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
           ::begin(this_02);
  tile = (unique_ptr<QPushButton,_std::default_delete<QPushButton>_> *)
         std::
         vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
         ::end(this_02);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_*,_std::vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>_>
                      (&__end1,(__normal_iterator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_*,_std::vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>_>
                                *)&tile);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_88 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_*,_std::vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>_>
               ::operator*(&__end1);
    pQVar7 = std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>::operator->(local_88);
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (this_00,(size_type)__range1);
    QString::number((ulong)&nullValue,(int)*pvVar4 + 1);
    QAbstractButton::setText((QString *)pQVar7);
    QString::~QString((QString *)&nullValue);
    pQVar7 = std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>::operator->(local_88);
    QWidget::setStyleSheet((QString *)pQVar7);
    pQVar7 = std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>::operator->(local_88);
    QWidget::setFont((QFont *)pQVar7);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_*,_std::vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>_>
    ::operator++(&__end1);
    __range1 = (vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
                *)((long)&(__range1->
                          super__Vector_base<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1);
  }
  pCVar3 = std::unique_ptr<Controller,_std::default_delete<Controller>_>::operator->
                     (&this->controller);
  uVar2 = Controller::getNullValue(pCVar3);
  iter._M_current = (unsigned_long *)(ulong)uVar2;
  local_b8._M_current =
       (unsigned_long *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(this_00);
  local_c0 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(this_00);
  local_b0 = std::
             find<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                       (local_b8,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  )local_c0,(unsigned_long *)&iter);
  local_c8 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(this_00);
  local_d0 = local_b0._M_current;
  sVar5 = std::
          distance<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )local_c8,local_b0);
  pvVar6 = std::
           vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
           ::operator[](this_02,sVar5);
  pQVar7 = std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>::operator->(pvVar6);
  local_d4 = EMPTY;
  std::
  map<TileColor,_const_QString,_std::less<TileColor>,_std::allocator<std::pair<const_TileColor,_const_QString>_>_>
  ::at(&Maps::tileColorStyle,&local_d4);
  QWidget::setStyleSheet((QString *)pQVar7);
  local_e0 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(this_00);
  local_e8 = local_b0._M_current;
  sVar5 = std::
          distance<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )local_e0,local_b0);
  pvVar6 = std::
           vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
           ::operator[](this_02,sVar5);
  pQVar7 = std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>::operator->(pvVar6);
  QString::QString(&local_100,(char *)0x0);
  QAbstractButton::setText((QString *)pQVar7);
  QString::~QString(&local_100);
  QString::~QString((QString *)&tiles);
  QFont::~QFont(local_30);
  return;
}

Assistant:

void Fifteen::setTilesNumeric()
{
    const auto& values = controller->getValues();

    size_t fontSize = controller->getFontSize();
    QFont font;
    font.setPixelSize( fontSize );
    auto tileColor = Options::getTileColor();

    auto& tiles = tilesBoard->getTiles();
    size_t valuesIndex = 0;
    for ( auto& tile : tiles )
    {
        tile->setText( QString::number( values[ valuesIndex++ ] + 1 ));
        tile->setStyleSheet( tileColor );
        tile->setFont( font );
    }

    size_t nullValue = controller->getNullValue();
    auto iter = std::find( values.begin(), values.end(), nullValue );
    tiles[ std::distance( values.begin(), iter )]->setStyleSheet( Maps::tileColorStyle.at( TileColor::EMPTY ));
    tiles[ std::distance( values.begin(), iter )]->setText( nullptr );
}